

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrSceneComponentsGetInfoMSFT *value)

{
  pointer *this;
  bool bVar1;
  string local_410 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_3f0;
  allocator local_3d1;
  string local_3d0 [32];
  string local_3b0 [32];
  ostringstream local_390 [8];
  ostringstream oss_enum;
  allocator local_211;
  string local_210 [39];
  allocator local_1e9;
  string local_1e8 [39];
  allocator local_1c1;
  string local_1c0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1a0;
  allocator local_181;
  string local_180 [32];
  undefined1 local_160 [40];
  string local_138 [8];
  string error_message;
  allocator local_111;
  string local_110 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_f0;
  allocator local_d1;
  string local_d0 [36];
  NextChainResult local_ac;
  value_type local_a8;
  NextChainResult next_result;
  value_type local_a0 [5];
  value_type local_8c;
  undefined1 local_88 [8];
  vector<XrStructureType,_std::allocator<XrStructureType>_> encountered_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> duplicate_ext_structs;
  vector<XrStructureType,_std::allocator<XrStructureType>_> valid_ext_structs;
  XrResult xr_result;
  XrSceneComponentsGetInfoMSFT *value_local;
  bool check_pnext_local;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = XR_SUCCESS;
  if (value->type != XR_TYPE_SCENE_COMPONENTS_GET_INFO_MSFT) {
    InvalidStructureType
              (instance_info,command_name,objects_info,"XrSceneComponentsGetInfoMSFT",value->type,
               "VUID-XrSceneComponentsGetInfoMSFT-type-type",XR_TYPE_SCENE_COMPONENTS_GET_INFO_MSFT,
               "XR_TYPE_SCENE_COMPONENTS_GET_INFO_MSFT");
    valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
  }
  if (check_pnext) {
    this = &duplicate_ext_structs.
            super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    local_8c = XR_TYPE_SCENE_COMPONENT_PARENT_FILTER_INFO_MSFT;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)this,&local_8c);
    local_a0[0] = XR_TYPE_SCENE_MARKER_TYPE_FILTER_MSFT;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,local_a0);
    next_result = 0x3b9c44f2;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(value_type *)&next_result);
    local_a8 = XR_TYPE_SCENE_PLANE_ALIGNMENT_FILTER_INFO_MSFT;
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::push_back
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,&local_a8);
    local_ac = ValidateNextChain(instance_info,command_name,objects_info,value->next,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                 &duplicate_ext_structs.
                                  super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)
                                 local_88,(vector<XrStructureType,_std::allocator<XrStructureType>_>
                                           *)&encountered_structs.
                                              super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (local_ac == NEXT_CHAIN_RESULT_ERROR) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_d0,"VUID-XrSceneComponentsGetInfoMSFT-next-next",&local_d1)
      ;
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_f0,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_110,
                 "Invalid structure(s) in \"next\" chain for XrSceneComponentsGetInfoMSFT struct \"next\""
                 ,&local_111);
      CoreValidLogMessage(instance_info,(string *)local_d0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_f0,(string *)local_110);
      std::__cxx11::string::~string(local_110);
      std::allocator<char>::~allocator((allocator<char> *)&local_111);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_f0);
      std::__cxx11::string::~string(local_d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_d1);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (local_ac == NEXT_CHAIN_RESULT_DUPLICATE_STRUCT) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_138,"Multiple structures of the same type(s) in \"next\" chain for ",
                 (allocator *)(local_160 + 0x27));
      std::allocator<char>::~allocator((allocator<char> *)(local_160 + 0x27));
      std::__cxx11::string::operator+=(local_138,"XrSceneComponentsGetInfoMSFT : ");
      StructTypesToString_abi_cxx11_
                ((GenValidUsageXrInstanceInfo *)local_160,
                 (vector<XrStructureType,_std::allocator<XrStructureType>_> *)instance_info);
      std::__cxx11::string::operator+=(local_138,(string *)local_160);
      std::__cxx11::string::~string((string *)local_160);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_180,"VUID-XrSceneComponentsGetInfoMSFT-next-unique",&local_181);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_1a0,objects_info);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_1c0,
                 "Multiple structures of the same type(s) in \"next\" chain for XrSceneComponentsGetInfoMSFT struct"
                 ,&local_1c1);
      CoreValidLogMessage(instance_info,(string *)local_180,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_1a0,(string *)local_1c0);
      std::__cxx11::string::~string(local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_1a0);
      std::__cxx11::string::~string(local_180);
      std::allocator<char>::~allocator((allocator<char> *)&local_181);
      valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::string::~string(local_138);
    }
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)local_88);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &encountered_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<XrStructureType,_std::allocator<XrStructureType>_>::~vector
              ((vector<XrStructureType,_std::allocator<XrStructureType>_> *)
               &duplicate_ext_structs.
                super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  if ((check_members) &&
     (valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ == XR_SUCCESS)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e8,"XrSceneComponentsGetInfoMSFT",&local_1e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_210,"componentType",&local_211);
    bVar1 = ValidateXrEnum(instance_info,command_name,(string *)local_1e8,(string *)local_210,
                           objects_info,value->componentType);
    std::__cxx11::string::~string(local_210);
    std::allocator<char>::~allocator((allocator<char> *)&local_211);
    std::__cxx11::string::~string(local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      instance_info_local._4_4_ =
           valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
           _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_390);
      std::operator<<((ostream *)local_390,
                      "XrSceneComponentsGetInfoMSFT contains invalid XrSceneComponentTypeMSFT \"componentType\" enum value "
                     );
      Uint32ToHexString_abi_cxx11_((uint32_t)local_3b0);
      std::operator<<((ostream *)local_390,local_3b0);
      std::__cxx11::string::~string(local_3b0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_3d0,"VUID-XrSceneComponentsGetInfoMSFT-componentType-parameter",&local_3d1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_3f0,objects_info);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage(instance_info,(string *)local_3d0,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                          command_name,&local_3f0,local_410);
      std::__cxx11::string::~string((string *)local_410);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_3f0);
      std::__cxx11::string::~string(local_3d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_3d1);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::ostringstream::~ostringstream(local_390);
    }
  }
  else {
    instance_info_local._4_4_ =
         valid_ext_structs.super__Vector_base<XrStructureType,_std::allocator<XrStructureType>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrSceneComponentsGetInfoMSFT* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // Make sure the structure type is correct
    if (value->type != XR_TYPE_SCENE_COMPONENTS_GET_INFO_MSFT) {
        InvalidStructureType(instance_info, command_name, objects_info, "XrSceneComponentsGetInfoMSFT",
                             value->type, "VUID-XrSceneComponentsGetInfoMSFT-type-type", XR_TYPE_SCENE_COMPONENTS_GET_INFO_MSFT, "XR_TYPE_SCENE_COMPONENTS_GET_INFO_MSFT");
        xr_result = XR_ERROR_VALIDATION_FAILURE;
    }
    if (check_pnext) {
        std::vector<XrStructureType> valid_ext_structs;
        std::vector<XrStructureType> duplicate_ext_structs;
        std::vector<XrStructureType> encountered_structs;
        valid_ext_structs.push_back(XR_TYPE_SCENE_COMPONENT_PARENT_FILTER_INFO_MSFT);
        valid_ext_structs.push_back(XR_TYPE_SCENE_MARKER_TYPE_FILTER_MSFT);
        valid_ext_structs.push_back(XR_TYPE_SCENE_OBJECT_TYPES_FILTER_INFO_MSFT);
        valid_ext_structs.push_back(XR_TYPE_SCENE_PLANE_ALIGNMENT_FILTER_INFO_MSFT);
        NextChainResult next_result = ValidateNextChain(instance_info, command_name, objects_info,
                                                         value->next, valid_ext_structs,
                                                         encountered_structs,
                                                         duplicate_ext_structs);
        // No valid extension structs for this 'next'.  Therefore, must be NULL
        // or only contain a list of valid extension structures.
        if (NEXT_CHAIN_RESULT_ERROR == next_result) {
            CoreValidLogMessage(instance_info, "VUID-XrSceneComponentsGetInfoMSFT-next-next",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info, "Invalid structure(s) in \"next\" chain for XrSceneComponentsGetInfoMSFT struct \"next\"");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        } else if (NEXT_CHAIN_RESULT_DUPLICATE_STRUCT == next_result) {
            std::string error_message = "Multiple structures of the same type(s) in \"next\" chain for ";
            error_message += "XrSceneComponentsGetInfoMSFT : ";
            error_message += StructTypesToString(instance_info, duplicate_ext_structs);
            CoreValidLogMessage(instance_info, "VUID-XrSceneComponentsGetInfoMSFT-next-unique",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                                objects_info,
            "Multiple structures of the same type(s) in \"next\" chain for XrSceneComponentsGetInfoMSFT struct");
            xr_result = XR_ERROR_VALIDATION_FAILURE;
        }
    }
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    // Make sure the enum type XrSceneComponentTypeMSFT value is valid
    if (!ValidateXrEnum(instance_info, command_name, "XrSceneComponentsGetInfoMSFT", "componentType", objects_info, value->componentType)) {
        std::ostringstream oss_enum;
        oss_enum << "XrSceneComponentsGetInfoMSFT contains invalid XrSceneComponentTypeMSFT \"componentType\" enum value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->componentType));
        CoreValidLogMessage(instance_info, "VUID-XrSceneComponentsGetInfoMSFT-componentType-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}